

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

VmValue * anon_unknown.dwarf_c91b1::CreateCompareNotEqual
                    (VmModule *module,SynBase *source,VmValue *lhs,VmValue *rhs)

{
  bool bVar1;
  VmInstruction *pVVar2;
  VmType type;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 uVar3;
  VmValue *rhs_local;
  VmValue *lhs_local;
  SynBase *source_local;
  VmModule *module_local;
  
  bVar1 = VmType::operator==(&lhs->type,&VmType::Int);
  uVar3 = true;
  if (!bVar1) {
    bVar1 = VmType::operator==(&lhs->type,&VmType::Double);
    uVar3 = true;
    if (!bVar1) {
      bVar1 = VmType::operator==(&lhs->type,&VmType::Long);
      uVar3 = true;
      if (!bVar1) {
        uVar3 = (lhs->type).type == VM_TYPE_POINTER;
      }
    }
  }
  if ((bool)uVar3 == false) {
    __assert_fail("lhs->type == VmType::Int || lhs->type == VmType::Double || lhs->type == VmType::Long || lhs->type.type == VM_TYPE_POINTER"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x284,
                  "VmValue *(anonymous namespace)::CreateCompareNotEqual(VmModule *, SynBase *, VmValue *, VmValue *)"
                 );
  }
  bVar1 = VmType::operator==(&lhs->type,&rhs->type);
  if (!bVar1) {
    __assert_fail("lhs->type == rhs->type",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x285,
                  "VmValue *(anonymous namespace)::CreateCompareNotEqual(VmModule *, SynBase *, VmValue *, VmValue *)"
                 );
  }
  type.structType = (TypeBase *)0x2d;
  type._0_8_ = VmType::Int.structType;
  pVVar2 = CreateInstruction((anon_unknown_dwarf_c91b1 *)module,(VmModule *)source,
                             (SynBase *)VmType::Int._0_8_,type,(VmInstructionType)lhs,rhs,
                             (VmValue *)CONCAT17(uVar3,in_stack_ffffffffffffffc0));
  return &pVVar2->super_VmValue;
}

Assistant:

VmValue* CreateCompareNotEqual(VmModule *module, SynBase *source, VmValue *lhs, VmValue *rhs)
	{
		assert(lhs->type == VmType::Int || lhs->type == VmType::Double || lhs->type == VmType::Long || lhs->type.type == VM_TYPE_POINTER);
		assert(lhs->type == rhs->type);

		return CreateInstruction(module, source, VmType::Int, VM_INST_NOT_EQUAL, lhs, rhs);
	}